

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

Exp2LayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_exp2(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 700) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 700;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    Exp2LayerParams::Exp2LayerParams(this_00.exp2_);
    (this->layer_).exp2_ = (Exp2LayerParams *)this_00;
  }
  return (Exp2LayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::Exp2LayerParams* NeuralNetworkLayer::mutable_exp2() {
  if (!has_exp2()) {
    clear_layer();
    set_has_exp2();
    layer_.exp2_ = new ::CoreML::Specification::Exp2LayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.exp2)
  return layer_.exp2_;
}